

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_crop.c
# Opt level: O2

gdImagePtr gdImageCropAuto(gdImagePtr im,uint mode)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  gdImagePtr pgVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  int x;
  int r;
  int iVar11;
  int iVar12;
  int iVar13;
  bool bVar14;
  gdRect local_40;
  
  x = im->sx;
  iVar1 = im->sy;
  switch(mode) {
  default:
    uVar8 = im->transparent;
    goto LAB_00112960;
  case 2:
    r = 0;
    iVar12 = 0;
    iVar11 = 0;
    break;
  case 3:
    r = 0xff;
    iVar12 = 0xff;
    iVar11 = 0xff;
    break;
  case 4:
    uVar5 = gdImageGetPixel(im,0,0);
    uVar2 = gdImageGetPixel(im,im->sx + -1,0);
    uVar3 = gdImageGetPixel(im,0,im->sy + -1);
    uVar4 = gdImageGetPixel(im,im->sx + -1,im->sy + -1);
    uVar8 = uVar2;
    if ((uVar2 == uVar4 && uVar2 == uVar3) || (uVar8 = uVar5, uVar5 == uVar4 && uVar5 == uVar3))
    goto LAB_00112960;
    if ((uVar5 == uVar2 && uVar5 == uVar3) || (uVar5 == uVar2 && uVar5 == uVar4)) goto LAB_00112960;
    uVar8 = uVar2;
    if ((uVar5 == uVar3 || uVar5 == uVar2) || uVar5 == uVar4) {
      uVar8 = uVar5;
    }
    if (((uVar2 == uVar3) || ((uVar5 == uVar3 || uVar5 == uVar2) || uVar5 == uVar4)) ||
       (uVar8 = uVar3, uVar4 == uVar3)) goto LAB_00112960;
    iVar13 = im->trueColor;
    if (iVar13 == 0) {
      iVar11 = im->red[(int)uVar2] + im->red[(int)uVar5] + im->red[(int)uVar3];
      uVar8 = im->red[(int)uVar4];
    }
    else {
      iVar11 = (uVar3 >> 0x10 & 0xff) + (uVar2 >> 0x10 & 0xff) + (uVar5 >> 0x10 & 0xff);
      uVar8 = uVar4 >> 0x10 & 0xff;
    }
    if (iVar13 == 0) {
      iVar12 = im->green[(int)uVar2] + im->green[(int)uVar5] + im->green[(int)uVar3];
      uVar9 = im->green[(int)uVar4];
    }
    else {
      iVar12 = (uVar3 >> 8 & 0xff) + (uVar2 >> 8 & 0xff) + (uVar5 >> 8 & 0xff);
      uVar9 = uVar4 >> 8 & 0xff;
    }
    if (iVar13 == 0) {
      iVar6 = im->blue[(int)uVar2] + im->blue[(int)uVar5] + im->blue[(int)uVar3];
      uVar10 = im->blue[(int)uVar4];
    }
    else {
      iVar6 = (uVar3 & 0xff) + (uVar2 & 0xff) + (uVar5 & 0xff);
      uVar10 = uVar4 & 0xff;
    }
    r = (int)((float)((int)(iVar11 + uVar8) / 4) + 0.5);
    iVar12 = (int)((float)((int)(iVar12 + uVar9) / 4) + 0.5);
    iVar11 = (int)((float)((int)(iVar6 + uVar10) / 4) + 0.5);
    if (iVar13 == 0) {
      iVar13 = im->alpha[(int)uVar2] + im->alpha[(int)uVar5] + im->alpha[(int)uVar3];
      uVar8 = im->alpha[(int)uVar4];
    }
    else {
      iVar13 = (uVar3 >> 0x18 & 0x7f) + (uVar2 >> 0x18 & 0x7f) + (uVar5 >> 0x18 & 0x7f);
      uVar8 = uVar4 >> 0x18 & 0x7f;
    }
    iVar13 = (int)((float)((int)(iVar13 + uVar8) / 4) + 0.5);
    goto LAB_00112958;
  }
  iVar13 = 0;
LAB_00112958:
  uVar8 = gdImageColorClosestAlpha(im,r,iVar12,iVar11,iVar13);
LAB_00112960:
  bVar14 = true;
  for (iVar13 = 0; (bVar14 && (iVar13 < iVar1)); iVar13 = iVar13 + 1) {
    bVar14 = true;
    for (iVar11 = 0; (bVar14 && (iVar11 < x)); iVar11 = iVar11 + 1) {
      uVar5 = gdImageGetPixel(im,iVar11,iVar13);
      bVar14 = uVar8 == uVar5;
    }
  }
  iVar11 = iVar1 + -1;
  if (iVar13 == iVar11) {
    pgVar7 = (gdImagePtr)0x0;
  }
  else {
    local_40.y = iVar13 + -1;
    bVar14 = true;
    for (; (bVar14 && (-1 < iVar11)); iVar11 = iVar11 + -1) {
      bVar14 = true;
      for (iVar12 = 0; (bVar14 && (iVar12 < x)); iVar12 = iVar12 + 1) {
        uVar5 = gdImageGetPixel(im,iVar12,iVar11);
        bVar14 = uVar8 == uVar5;
      }
    }
    local_40.height = (iVar1 - iVar13) + 2;
    if (iVar11 != 0) {
      local_40.height = (iVar11 - iVar13) + 3;
    }
    iVar1 = iVar13 + -2 + local_40.height;
    bVar14 = true;
    for (iVar13 = 0; (bVar14 && (iVar13 < x)); iVar13 = iVar13 + 1) {
      bVar14 = true;
      for (iVar11 = 0; (bVar14 && (iVar11 < iVar1)); iVar11 = iVar11 + 1) {
        uVar5 = gdImageGetPixel(im,iVar13,iVar11);
        bVar14 = uVar8 == uVar5;
      }
    }
    local_40.x = iVar13 + -1;
    bVar14 = true;
    while ((bVar14 && (0 < x))) {
      x = x + -1;
      bVar14 = true;
      for (iVar11 = 0; (bVar14 && (iVar11 < iVar1)); iVar11 = iVar11 + 1) {
        uVar5 = gdImageGetPixel(im,x,iVar11);
        bVar14 = uVar8 == uVar5;
      }
    }
    local_40.width = (x - iVar13) + 2;
    pgVar7 = gdImageCrop(im,&local_40);
  }
  return pgVar7;
}

Assistant:

BGD_DECLARE(gdImagePtr) gdImageCropAuto(gdImagePtr im, const unsigned int mode)
{
	const int width = gdImageSX(im);
	const int height = gdImageSY(im);

	int x,y;
	int color, match;
	gdRect crop;

	crop.x = 0;
	crop.y = 0;
	crop.width = 0;
	crop.height = 0;

	switch (mode) {
	case GD_CROP_TRANSPARENT:
		color = gdImageGetTransparent(im);
		break;

	case GD_CROP_BLACK:
		color = gdImageColorClosestAlpha(im, 0, 0, 0, 0);
		break;

	case GD_CROP_WHITE:
		color = gdImageColorClosestAlpha(im, 255, 255, 255, 0);
		break;

	case GD_CROP_SIDES:
		gdGuessBackgroundColorFromCorners(im, &color);
		break;

	case GD_CROP_DEFAULT:
	default:
		color = gdImageGetTransparent(im);
		break;
	}

	/* TODO: Add gdImageGetRowPtr and works with ptr at the row level
	 * for the true color and palette images
	 * new formats will simply work with ptr
	 */
	match = 1;
	for (y = 0; match && y < height; y++) {
		for (x = 0; match && x < width; x++) {
			match = (color == gdImageGetPixel(im, x,y));
		}
	}

	/* Nothing to do > bye
	 * Duplicate the image?
	 */
	if (y == height - 1) {
		return NULL;
	}

	crop.y = y -1;
	match = 1;
	for (y = height - 1; match && y >= 0; y--) {
		for (x = 0; match && x < width; x++) {
			match = (color == gdImageGetPixel(im, x,y));
		}
	}

	if (y == 0) {
		crop.height = height - crop.y + 1;
	} else {
		crop.height = y - crop.y + 2;
	}

	match = 1;
	for (x = 0; match && x < width; x++) {
		for (y = 0; match && y < crop.y + crop.height - 1; y++) {
			match = (color == gdImageGetPixel(im, x,y));
		}
	}
	crop.x = x - 1;

	match = 1;
	for (x = width - 1; match && x >= 0; x--) {
		for (y = 0; match &&  y < crop.y + crop.height - 1; y++) {
			match = (color == gdImageGetPixel(im, x,y));
		}
	}
	crop.width = x - crop.x + 2;

	return gdImageCrop(im, &crop);
}